

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue_read.cpp
# Opt level: O2

ssize_t __thiscall UniValue::read(UniValue *this,int __fd,void *__buf,size_t __nbytes)

{
  uint uVar1;
  long lVar2;
  string str;
  string str_00;
  string str_01;
  bool bVar3;
  pointer ppUVar4;
  jtokentype jVar5;
  jtokentype jVar6;
  ulong uVar7;
  char *end;
  ulong uVar8;
  undefined4 in_register_00000034;
  byte bVar9;
  long in_FS_OFFSET;
  bool bVar10;
  UniValue *pUVar11;
  pointer in_stack_fffffffffffffec0;
  UniValue *newTop;
  uint consumed;
  vector<UniValue_*,_std::allocator<UniValue_*>_> stack;
  string local_110 [32];
  string local_f0 [32];
  undefined1 *local_d0;
  undefined8 local_c8;
  undefined1 local_c0 [16];
  UniValue tmpVal;
  string tokenVal;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  clear(this);
  stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tokenVal._M_dataplus._M_p = (pointer)&tokenVal.field_2;
  tokenVal._M_string_length = 0;
  tokenVal.field_2._M_local_buf[0] = '\0';
  end = (char *)(CONCAT44(in_register_00000034,__fd) + (long)__buf);
  bVar9 = 0;
  bVar3 = false;
  jVar6 = JTOK_NONE;
  do {
    jVar5 = getJsonToken(&tokenVal,&consumed,(char *)__buf,end);
    if ((uint)(jVar5 + JTOK_OBJ_OPEN) < 2) {
switchD_0011062c_default:
      uVar8 = 0;
      goto LAB_00110a3c;
    }
    uVar7 = (ulong)consumed;
    uVar1 = jVar5 + ~JTOK_COMMA;
    if ((bVar9 & 8) != 0) {
      if ((uVar1 < 5) || ((jVar5 | JTOK_OBJ_CLOSE) == JTOK_ARR_OPEN)) {
        bVar9 = bVar9 & 0xf7;
        goto LAB_001105e7;
      }
      goto switchD_0011062c_default;
    }
    if ((bVar9 & 4) != 0) {
      if (uVar1 < 5) {
        if ((bVar9 & 0x10) != 0) goto switchD_0011062c_default;
        bVar9 = bVar9 & 0xf3;
        goto LAB_00110611;
      }
      if (((uint)jVar5 < 5) && ((0x1aU >> (jVar5 & 0x1f) & 1) != 0)) {
        bVar9 = bVar9 & 0xf3;
      }
      uVar8 = 0;
      if (((uint)jVar5 < 5) && ((0x1aU >> (jVar5 & 0x1f) & 1) != 0)) goto LAB_001105e7;
      goto LAB_00110a3c;
    }
    if (bVar3) {
      if ((jVar5 == JTOK_OBJ_CLOSE) || (jVar5 == JTOK_STRING)) goto LAB_001105e7;
      goto switchD_0011062c_default;
    }
    if ((bVar9 & 2) != 0) {
      if (jVar5 == JTOK_COLON) {
        bVar9 = bVar9 & 0xf0;
        bVar3 = false;
        goto LAB_001105e7;
      }
      goto switchD_0011062c_default;
    }
    if (jVar5 == JTOK_COLON) goto switchD_0011062c_default;
LAB_001105e7:
    if ((bVar9 & 0x10) != 0) {
      if ((uVar1 < 5) || ((jVar5 | JTOK_OBJ_CLOSE) == JTOK_ARR_OPEN)) goto switchD_0011062c_default;
      bVar9 = bVar9 & 0xef;
    }
LAB_00110611:
    switch(jVar5) {
    case JTOK_OBJ_OPEN:
    case JTOK_ARR_OPEN:
      if (stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        pUVar11 = this;
        if (jVar5 == JTOK_OBJ_OPEN) {
          setObject(this);
        }
        else {
          setArray(this);
        }
        tmpVal._0_8_ = this;
        std::vector<UniValue*,std::allocator<UniValue*>>::emplace_back<UniValue*>
                  ((vector<UniValue*,std::allocator<UniValue*>> *)&stack,(UniValue **)&tmpVal);
      }
      else {
        local_d0 = local_c0;
        local_c8 = 0;
        local_c0[0] = 0;
        str._M_string_length = (size_type)this;
        str._M_dataplus._M_p = (pointer)uVar7;
        str.field_2._M_allocated_capacity = (size_type)end;
        str.field_2._8_8_ = in_stack_fffffffffffffec0;
        UniValue(&tmpVal,(jVar5 != JTOK_OBJ_OPEN) + VOBJ,str);
        std::__cxx11::string::~string((string *)&local_d0);
        pUVar11 = stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1];
        std::vector<UniValue,_std::allocator<UniValue>_>::push_back(&pUVar11->values,&tmpVal);
        newTop = (pUVar11->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                 super__Vector_impl_data._M_finish + -1;
        std::vector<UniValue_*,_std::allocator<UniValue_*>_>::push_back(&stack,&newTop);
        ~UniValue(&tmpVal);
        pUVar11 = this;
      }
      if (0x1000 < (ulong)((long)stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>.
                                _M_impl.super__Vector_impl_data._M_start))
      goto switchD_0011062c_default;
      bVar9 = bVar9 | (jVar5 != JTOK_OBJ_OPEN) * '\x03' + 1U;
      bVar3 = (bool)(bVar3 | jVar5 == JTOK_OBJ_OPEN);
      this = pUVar11;
      break;
    case JTOK_OBJ_CLOSE:
    case JTOK_ARR_CLOSE:
      uVar8 = 0;
      if ((jVar6 == JTOK_COMMA) ||
         (stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.
          super__Vector_impl_data._M_start)) goto LAB_00110a3c;
      if ((jVar5 != JTOK_OBJ_CLOSE) + VOBJ !=
          stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.
          super__Vector_impl_data._M_finish[-1]->typ) goto switchD_0011062c_default;
      stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.
           super__Vector_impl_data._M_finish + -1;
      bVar9 = bVar9 & 0xee | 0x10;
      bVar3 = false;
      break;
    case JTOK_COLON:
      if ((stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.
           super__Vector_impl_data._M_finish ==
           stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.
           super__Vector_impl_data._M_start) ||
         (stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.
          super__Vector_impl_data._M_finish[-1]->typ != VOBJ)) goto switchD_0011062c_default;
      bVar9 = bVar9 | 8;
      break;
    case JTOK_COMMA:
      if (stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.
          super__Vector_impl_data._M_start) goto switchD_0011062c_default;
      uVar8 = 0;
      if ((jVar6 == JTOK_ARR_OPEN) || (jVar6 == JTOK_COMMA)) goto LAB_00110a3c;
      bVar10 = stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.
               super__Vector_impl_data._M_finish[-1]->typ != VOBJ;
      bVar9 = bVar9 | bVar10 * '\x03' + 1U;
      bVar3 = (bool)(bVar3 | !bVar10);
      break;
    case JTOK_KW_NULL:
    case JTOK_KW_TRUE:
    case JTOK_KW_FALSE:
      tmpVal.val._M_dataplus._M_p = (pointer)&tmpVal.val.field_2;
      tmpVal.val._M_string_length = 0;
      tmpVal.val.field_2._M_local_buf[0] = '\0';
      tmpVal._0_8_ = tmpVal._0_8_ & 0xffffffff00000000;
      tmpVal.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      tmpVal.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      tmpVal.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      tmpVal.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      tmpVal.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      tmpVal.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pUVar11 = this;
      if (jVar5 == JTOK_KW_FALSE) {
        bVar10 = false;
LAB_0011081f:
        setBool(&tmpVal,bVar10);
      }
      else if (jVar5 == JTOK_KW_TRUE) {
        bVar10 = true;
        goto LAB_0011081f;
      }
      if (stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        operator=(this,&tmpVal);
      }
      else {
        std::vector<UniValue,_std::allocator<UniValue>_>::push_back
                  (&stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.
                    super__Vector_impl_data._M_finish[-1]->values,&tmpVal);
LAB_00110846:
        bVar9 = bVar9 | 0x10;
      }
      goto LAB_001109d1;
    case JTOK_NUMBER:
      std::__cxx11::string::string(local_f0,&tokenVal);
      str_00._M_string_length = (size_type)this;
      str_00._M_dataplus._M_p = (pointer)uVar7;
      str_00.field_2._M_allocated_capacity = (size_type)end;
      str_00.field_2._8_8_ = in_stack_fffffffffffffec0;
      UniValue(&tmpVal,VNUM,str_00);
      std::__cxx11::string::~string(local_f0);
      if (stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        std::vector<UniValue,_std::allocator<UniValue>_>::push_back
                  (&stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.
                    super__Vector_impl_data._M_finish[-1]->values,&tmpVal);
        pUVar11 = this;
        goto LAB_00110846;
      }
      operator=(this,&tmpVal);
      pUVar11 = this;
LAB_001109d1:
      ~UniValue(&tmpVal);
      this = pUVar11;
      break;
    case JTOK_STRING:
      if (bVar3) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.
                     super__Vector_impl_data._M_finish[-1]->keys,&tokenVal);
        bVar9 = bVar9 & 0xfc | 2;
        bVar3 = false;
      }
      else {
        std::__cxx11::string::string(local_110,&tokenVal);
        str_01._M_string_length = (size_type)this;
        str_01._M_dataplus._M_p = (pointer)uVar7;
        str_01.field_2._M_allocated_capacity = (size_type)end;
        str_01.field_2._8_8_ = in_stack_fffffffffffffec0;
        UniValue(&tmpVal,VSTR,str_01);
        std::__cxx11::string::~string(local_110);
        ppUVar4 = stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        in_stack_fffffffffffffec0 =
             stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.
             super__Vector_impl_data._M_start;
        if (stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.
            super__Vector_impl_data._M_start) {
          operator=(this,&tmpVal);
        }
        else {
          std::vector<UniValue,_std::allocator<UniValue>_>::push_back
                    (&stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.
                      super__Vector_impl_data._M_finish[-1]->values,&tmpVal);
        }
        ~UniValue(&tmpVal);
        if (ppUVar4 == in_stack_fffffffffffffec0) break;
      }
      bVar9 = bVar9 | 0x10;
      break;
    default:
      goto switchD_0011062c_default;
    }
    __buf = (void *)((long)__buf + uVar7);
    jVar6 = jVar5;
  } while (stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.
           super__Vector_impl_data._M_start !=
           stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.
           super__Vector_impl_data._M_finish);
  jVar6 = getJsonToken(&tokenVal,&consumed,(char *)__buf,end);
  uVar8 = CONCAT71((int7)((ulong)&tmpVal >> 8),jVar6 == JTOK_NONE);
LAB_00110a3c:
  std::__cxx11::string::~string((string *)&tokenVal);
  std::_Vector_base<UniValue_*,_std::allocator<UniValue_*>_>::~_Vector_base
            (&stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return uVar8 & 0xffffffff;
}

Assistant:

bool UniValue::read(std::string_view str_in)
{
    clear();

    uint32_t expectMask = 0;
    std::vector<UniValue*> stack;

    std::string tokenVal;
    unsigned int consumed;
    enum jtokentype tok = JTOK_NONE;
    enum jtokentype last_tok = JTOK_NONE;
    const char* raw{str_in.data()};
    const char* end{raw + str_in.size()};
    do {
        last_tok = tok;

        tok = getJsonToken(tokenVal, consumed, raw, end);
        if (tok == JTOK_NONE || tok == JTOK_ERR)
            return false;
        raw += consumed;

        bool isValueOpen = jsonTokenIsValue(tok) ||
            tok == JTOK_OBJ_OPEN || tok == JTOK_ARR_OPEN;

        if (expect(VALUE)) {
            if (!isValueOpen)
                return false;
            clearExpect(VALUE);

        } else if (expect(ARR_VALUE)) {
            bool isArrValue = isValueOpen || (tok == JTOK_ARR_CLOSE);
            if (!isArrValue)
                return false;

            clearExpect(ARR_VALUE);

        } else if (expect(OBJ_NAME)) {
            bool isObjName = (tok == JTOK_OBJ_CLOSE || tok == JTOK_STRING);
            if (!isObjName)
                return false;

        } else if (expect(COLON)) {
            if (tok != JTOK_COLON)
                return false;
            clearExpect(COLON);

        } else if (!expect(COLON) && (tok == JTOK_COLON)) {
            return false;
        }

        if (expect(NOT_VALUE)) {
            if (isValueOpen)
                return false;
            clearExpect(NOT_VALUE);
        }

        switch (tok) {

        case JTOK_OBJ_OPEN:
        case JTOK_ARR_OPEN: {
            VType utyp = (tok == JTOK_OBJ_OPEN ? VOBJ : VARR);
            if (!stack.size()) {
                if (utyp == VOBJ)
                    setObject();
                else
                    setArray();
                stack.push_back(this);
            } else {
                UniValue tmpVal(utyp);
                UniValue *top = stack.back();
                top->values.push_back(tmpVal);

                UniValue *newTop = &(top->values.back());
                stack.push_back(newTop);
            }

            if (stack.size() > MAX_JSON_DEPTH)
                return false;

            if (utyp == VOBJ)
                setExpect(OBJ_NAME);
            else
                setExpect(ARR_VALUE);
            break;
            }

        case JTOK_OBJ_CLOSE:
        case JTOK_ARR_CLOSE: {
            if (!stack.size() || (last_tok == JTOK_COMMA))
                return false;

            VType utyp = (tok == JTOK_OBJ_CLOSE ? VOBJ : VARR);
            UniValue *top = stack.back();
            if (utyp != top->getType())
                return false;

            stack.pop_back();
            clearExpect(OBJ_NAME);
            setExpect(NOT_VALUE);
            break;
            }

        case JTOK_COLON: {
            if (!stack.size())
                return false;

            UniValue *top = stack.back();
            if (top->getType() != VOBJ)
                return false;

            setExpect(VALUE);
            break;
            }

        case JTOK_COMMA: {
            if (!stack.size() ||
                (last_tok == JTOK_COMMA) || (last_tok == JTOK_ARR_OPEN))
                return false;

            UniValue *top = stack.back();
            if (top->getType() == VOBJ)
                setExpect(OBJ_NAME);
            else
                setExpect(ARR_VALUE);
            break;
            }

        case JTOK_KW_NULL:
        case JTOK_KW_TRUE:
        case JTOK_KW_FALSE: {
            UniValue tmpVal;
            switch (tok) {
            case JTOK_KW_NULL:
                // do nothing more
                break;
            case JTOK_KW_TRUE:
                tmpVal.setBool(true);
                break;
            case JTOK_KW_FALSE:
                tmpVal.setBool(false);
                break;
            default: /* impossible */ break;
            }

            if (!stack.size()) {
                *this = tmpVal;
                break;
            }

            UniValue *top = stack.back();
            top->values.push_back(tmpVal);

            setExpect(NOT_VALUE);
            break;
            }

        case JTOK_NUMBER: {
            UniValue tmpVal(VNUM, tokenVal);
            if (!stack.size()) {
                *this = tmpVal;
                break;
            }

            UniValue *top = stack.back();
            top->values.push_back(tmpVal);

            setExpect(NOT_VALUE);
            break;
            }

        case JTOK_STRING: {
            if (expect(OBJ_NAME)) {
                UniValue *top = stack.back();
                top->keys.push_back(tokenVal);
                clearExpect(OBJ_NAME);
                setExpect(COLON);
            } else {
                UniValue tmpVal(VSTR, tokenVal);
                if (!stack.size()) {
                    *this = tmpVal;
                    break;
                }
                UniValue *top = stack.back();
                top->values.push_back(tmpVal);
            }

            setExpect(NOT_VALUE);
            break;
            }

        default:
            return false;
        }
    } while (!stack.empty ());

    /* Check that nothing follows the initial construct (parsed above).  */
    tok = getJsonToken(tokenVal, consumed, raw, end);
    if (tok != JTOK_NONE)
        return false;

    return true;
}